

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_merge_to_ctx(lyd_node **trg,lyd_node *src,int options,ly_ctx *ctx)

{
  lyd_node **pplVar1;
  ly_ctx *plVar2;
  bool bVar3;
  int iVar4;
  uint dflt;
  lys_node *plVar5;
  lyd_node *plVar6;
  lyd_node *plVar7;
  char *pcVar8;
  lys_module *plVar9;
  lyd_node *plVar10;
  char *format;
  ly_ctx *ctx_00;
  lyd_node *plVar11;
  lyd_node *sibling;
  int iVar12;
  lyd_node *local_70;
  lyd_node *local_68;
  lys_node *local_60;
  int local_40;
  
  if ((trg == (lyd_node **)0x0) ||
     (plVar7 = *trg, src == (lyd_node *)0x0 || plVar7 == (lyd_node *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_merge_to_ctx");
    return -1;
  }
  for (plVar5 = lys_parent(plVar7->schema); plVar5 != (lys_node *)0x0; plVar5 = lys_parent(plVar5))
  {
    if (plVar5->nodetype != LYS_USES) {
      pcVar8 = lyp_get_yang_data_template_name(plVar7);
      if (pcVar8 == (char *)0x0) {
        ly_log(plVar5->module->ctx,LY_LLERR,LY_EINVAL,"Target not a top-level data tree.");
        return -1;
      }
      break;
    }
  }
  if ((ctx == (ly_ctx *)0x0) || (plVar7->schema->module->ctx == ctx)) {
    plVar2 = src->schema->module->ctx;
    ctx_00 = plVar7->schema->module->ctx;
    if ((plVar2 == ctx_00) && (ctx_00 = ctx, plVar2 == ctx)) {
      ctx_00 = (ly_ctx *)0x0;
    }
  }
  else {
    do {
      sibling = plVar7;
      plVar7 = sibling->prev;
    } while (sibling->prev->next != (lyd_node *)0x0);
    *trg = sibling;
    plVar7 = (lyd_node *)0x0;
    for (; ctx_00 = ctx, sibling != (lyd_node *)0x0; sibling = sibling->next) {
      plVar6 = lyd_dup_to_ctx(sibling,1,ctx);
      if ((plVar6 == (lyd_node *)0x0) ||
         ((plVar7 != (lyd_node *)0x0 &&
          (iVar4 = lyd_insert_after(plVar7->prev,plVar6), plVar6 = plVar7, iVar4 != 0)))) {
        plVar7 = (lyd_node *)0x0;
        goto LAB_00169eb2;
      }
      plVar7 = plVar6;
    }
  }
  sibling = plVar7;
  plVar5 = lys_parent(src->schema);
  if (plVar5 == (lys_node *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = 0;
    do {
      if (plVar5->nodetype == LYS_EXT) break;
      local_40 = local_40 + 1;
      plVar5 = lys_parent(plVar5);
    } while (plVar5 != (lys_node *)0x0);
  }
  bVar3 = true;
  dflt = 1;
  if (local_40 != 0) {
    plVar7 = src;
    if (((uint)options >> 0xc & 1) == 0) {
      do {
        if ((plVar7->field_0x9 & 1) == 0) {
          dflt = 0;
          goto LAB_00169b73;
        }
        pplVar1 = &plVar7->next;
        plVar7 = *pplVar1;
      } while (*pplVar1 != (lyd_node *)0x0);
      dflt = 1;
    }
    else {
      dflt = (byte)src->field_0x9 & 1;
    }
  }
LAB_00169b73:
  local_70 = (lyd_node *)0x0;
  local_60 = (lys_node *)0x0;
  iVar4 = 0;
  local_68 = sibling;
  plVar6 = (lyd_node *)0x0;
  do {
    do {
      plVar7 = plVar6;
      plVar5 = src->schema;
      if (iVar4 < local_40) {
        iVar12 = 0;
        do {
          plVar5 = lys_parent(plVar5);
          iVar12 = iVar12 + 1;
        } while (iVar12 < local_40 - iVar4);
      }
      if (plVar5 == src->schema) {
LAB_00169cf4:
        plVar6 = src;
        if (((uint)options >> 10 & 1) != 0) goto LAB_00169d56;
        plVar11 = (lyd_node *)0x0;
        goto LAB_00169d09;
      }
      iVar4 = iVar4 + 1;
      plVar6 = plVar7;
    } while ((plVar5->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    if (plVar5 == src->schema) goto LAB_00169cf4;
    if (plVar5->nodetype != LYS_CONTAINER) {
      pcVar8 = strnodetype(plVar5->nodetype);
      format = "Cannot create %s \"%s\" for the merge.";
LAB_00169f3c:
      ly_log(ctx_00,LY_LLERR,LY_EINVAL,format,pcVar8);
      break;
    }
    if (plVar7 == (lyd_node *)0x0) {
      local_70 = local_68;
      if (!bVar3) {
        local_70 = local_68->child;
      }
      for (; plVar11 = local_68, local_70 != (lyd_node *)0x0; local_70 = local_70->next) {
        local_60 = plVar5;
        if ((ctx_00 != (ly_ctx *)0x0) &&
           (local_60 = lys_get_schema_inctx(plVar5,ctx_00), local_60 == (lys_node *)0x0)) {
          plVar9 = lys_node_module(plVar5);
          plVar7 = (lyd_node *)0x0;
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,
                 "Target context does not contain schema node for the data node being merged (%s:%s)."
                 ,plVar9->name,plVar5->name);
          goto LAB_00169eb2;
        }
        plVar11 = local_70;
        if (local_70->schema == local_60) break;
      }
      local_68 = plVar11;
      if (((uint)options >> 10 & 1) == 0) {
        plVar5 = local_60;
      }
      bVar3 = false;
    }
    else if ((((uint)options >> 10 & 1) == 0 && ctx_00 != (ly_ctx *)0x0) &&
            (plVar5 = lys_get_schema_inctx(plVar5,ctx_00), plVar5 == (lys_node *)0x0)) {
      plVar9 = lys_node_module((lys_node *)0x0);
      pcVar8 = plVar9->name;
      format = "Target context does not contain schema node for the data node being merged (%s:%s)."
      ;
      goto LAB_00169f3c;
    }
  } while (((local_70 != (lyd_node *)0x0) ||
           (plVar6 = _lyd_new((lyd_node *)0x0,plVar5,dflt), plVar7 == (lyd_node *)0x0)) ||
          (iVar12 = lyd_insert(plVar6,plVar7), iVar12 == 0));
  goto LAB_00169eb2;
  while (pplVar1 = &plVar6->next, plVar6 = *pplVar1, *pplVar1 != (lyd_node *)0x0) {
LAB_00169d56:
    check_leaf_list_backlinks(plVar6,2);
    if (((uint)options >> 0xc & 1) != 0) break;
  }
  plVar6 = src->prev;
  if (((uint)options >> 0xc & 1) != 0 && plVar6 != src) {
    lyd_unlink_internal(src,1);
    lyd_free_withsiblings(plVar6);
  }
  goto LAB_00169daa;
  while ((((uint)options >> 0xc & 1) == 0 &&
         (plVar6 = plVar6->next, plVar11 = src, plVar6 != (lyd_node *)0x0))) {
LAB_00169d09:
    src = lyd_dup_to_ctx(plVar6,1,ctx_00);
    if ((src == (lyd_node *)0x0) ||
       ((plVar11 != (lyd_node *)0x0 &&
        (iVar4 = lyd_insert_after(plVar11->prev,src), src = plVar11, iVar4 != 0)))) {
      lyd_free_withsiblings(plVar11);
      goto LAB_00169eb2;
    }
  }
LAB_00169daa:
  plVar6 = plVar7;
  plVar11 = src;
  if (plVar7 != (lyd_node *)0x0) {
    do {
      plVar10 = plVar6;
      plVar6 = plVar10->child;
    } while (plVar10->child != (lyd_node *)0x0);
    plVar10->child = src;
    do {
      src->parent = plVar10;
      src = src->next;
      plVar11 = plVar7;
    } while (src != (lyd_node *)0x0);
  }
  if (bVar3) {
    iVar4 = lyd_merge_siblings(local_68,plVar11,options);
  }
  else {
    iVar4 = lyd_merge_parent_children(local_68,plVar11,options);
  }
  if (iVar4 != 0) {
    plVar7 = sibling;
    if (iVar4 != 2) {
      plVar7 = (lyd_node *)0x0;
LAB_00169eb2:
      if (*trg != sibling) {
        lyd_free_withsiblings(sibling);
      }
      lyd_free_withsiblings(plVar7);
      return -1;
    }
joined_r0x00169e12:
    plVar6 = plVar7;
    if (plVar6 != (lyd_node *)0x0) {
      plVar6->validity = plVar6->validity & 0x7f;
      if ((plVar6->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar7 = plVar6->child;
      }
      else {
        plVar7 = (lyd_node *)0x0;
      }
      if (plVar7 == (lyd_node *)0x0) {
        if (plVar6 == sibling) goto LAB_00169e67;
        plVar7 = plVar6->next;
      }
      if (plVar7 == (lyd_node *)0x0) {
        do {
          plVar6 = plVar6->parent;
          if (plVar6->parent == sibling->parent) break;
          plVar7 = plVar6->next;
        } while (plVar7 == (lyd_node *)0x0);
      }
      goto joined_r0x00169e12;
    }
  }
LAB_00169e67:
  if (sibling->schema->nodetype == LYS_RPC) {
    lyd_schema_sort(sibling,1);
  }
  if (*trg != sibling) {
    lyd_free_withsiblings(*trg);
    *trg = sibling;
  }
  return 0;
}

Assistant:

API int
lyd_merge_to_ctx(struct lyd_node **trg, const struct lyd_node *src, int options, struct ly_ctx *ctx)
{
    struct lyd_node *node = NULL, *node2, *target, *trg_merge_start, *src_merge_start = NULL;
    const struct lyd_node *iter;
    struct lys_node *src_snode, *sch = NULL;
    int i, src_depth, depth, first_iter, ret, dflt = 1;
    const struct lys_node *parent = NULL;

    if (!trg || !(*trg) || !src) {
        LOGARG;
        return -1;
    }
    target = *trg;

    parent = lys_parent(target->schema);

    /* go up all uses */
    while (parent && (parent->nodetype == LYS_USES)) {
        parent = lys_parent(parent);
    }

    if (parent && !lyp_get_yang_data_template_name(target)) {
        LOGERR(parent->module->ctx, LY_EINVAL, "Target not a top-level data tree.");
        return -1;
    }

    /* get know if we are converting data into a different context */
    if (ctx && target->schema->module->ctx != ctx) {
        /* target's data tree context differs from the target context, move the target
         * data tree into the target context */

        /* get the first target's top-level and store it as the result */
        for (; target->prev->next; target = target->prev);
        *trg = target;

        for (node = NULL, trg_merge_start = target; target; target = target->next) {
            node2 = lyd_dup_to_ctx(target, 1, ctx);
            if (!node2) {
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    goto error;
                }
            } else {
                node = node2;
            }
        }
        target = node;
        node = NULL;
    } else if (src->schema->module->ctx != target->schema->module->ctx) {
        /* the source data will be converted into the target's context during the merge */
        ctx = target->schema->module->ctx;
    } else if (ctx == src->schema->module->ctx) {
        /* no conversion is needed */
        ctx = NULL;
    }

    /* find source top-level schema node */
    for (src_snode = src->schema, src_depth = 0;
         (src_snode = lys_parent(src_snode)) && src_snode->nodetype != LYS_EXT;
         ++src_depth);

    /* find first shared missing schema parent of the subtrees */
    trg_merge_start = target;
    depth = 0;
    first_iter = 1;
    if (src_depth) {
        /* we are going to create missing parents in the following loop,
         * but we will need to know a dflt flag for them. In case the newly
         * created parent is going to have at least one non-default child,
         * it will be also non-default, otherwise it will be the default node */
        if (options & LYD_OPT_NOSIBLINGS) {
            dflt = src->dflt;
        } else {
            LY_TREE_FOR(src, iter) {
                if (!iter->dflt) {
                    /* non default sibling -> parent is going to be
                     * created also as non-default */
                    dflt = 0;
                    break;
                }
            }
        }
    }
    while (1) {
        /* going from down (source root) to up (top-level or the common node with target */
        do {
            for (src_snode = src->schema, i = 0; i < src_depth - depth; src_snode = lys_parent(src_snode), ++i);
            ++depth;
        } while (src_snode != src->schema && (src_snode->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES)));

        if (src_snode == src->schema) {
            break;
        }

        if (src_snode->nodetype != LYS_CONTAINER) {
            /* we would have to create a list (the only data node with children except container), impossible */
            LOGERR(ctx, LY_EINVAL, "Cannot create %s \"%s\" for the merge.", strnodetype(src_snode->nodetype), src_snode->name);
            goto error;
        }

        /* have we created any missing containers already? if we did,
         * it is totally useless to search for match, there won't ever be */
        if (!src_merge_start) {
            if (first_iter) {
                node = trg_merge_start;
                first_iter = 0;
            } else {
                node = trg_merge_start->child;
            }

            /* find it in target data nodes */
            LY_TREE_FOR(node, node) {
                if (ctx) {
                    /* we have the schema nodes in the different context */
                    sch = lys_get_schema_inctx(src_snode, ctx);
                    if (!sch) {
                        LOGERR(ctx, LY_EINVAL, "Target context does not contain schema node for the data node being "
                               "merged (%s:%s).", lys_node_module(src_snode)->name, src_snode->name);
                        goto error;
                    }
                } else {
                    /* the context is same and comparison of the schema nodes will works fine */
                    sch = src_snode;
                }

                if (node->schema == sch) {
                    trg_merge_start = node;
                    break;
                }
            }

            if (!(options & LYD_OPT_DESTRUCT)) {
                /* the source tree will be duplicated, so to save some work in case
                 * of different target context, create also the parents nodes in the
                 * correct context */
                src_snode = sch;
            }
        } else if (ctx && !(options & LYD_OPT_DESTRUCT)) {
            /* get the schema node in the correct (target) context, same as above,
             * this is done to save some work and have the source in the same context
             * when the provided source tree is below duplicated in the target context
             * and connected into the parents created here */
            src_snode = lys_get_schema_inctx(src_snode, ctx);
            if (!src_snode) {
                LOGERR(ctx, LY_EINVAL, "Target context does not contain schema node for the data node being "
                       "merged (%s:%s).", lys_node_module(src_snode)->name, src_snode->name);
                goto error;
            }
        }

        if (!node) {
            /* it is not there, create it */
            node2 = _lyd_new(NULL, src_snode, dflt);
            if (!src_merge_start) {
                src_merge_start = node2;
            } else {
                if (lyd_insert(node2, src_merge_start)) {
                    goto error;
                }
                src_merge_start = node2;
            }
        }
    }

    /* process source according to options */
    if (options & LYD_OPT_DESTRUCT) {
        LY_TREE_FOR(src, iter) {
            check_leaf_list_backlinks((struct lyd_node *)iter, 2);
            if (options & LYD_OPT_NOSIBLINGS) {
                break;
            }
        }

        node = (struct lyd_node *)src;
        if ((node->prev != node) && (options & LYD_OPT_NOSIBLINGS)) {
            node2 = node->prev;
            lyd_unlink(node);
            lyd_free_withsiblings(node2);
        }
    } else {
        node = NULL;
        for (; src; src = src->next) {
            /* because we already have to duplicate it, do it in the correct context */
            node2 = lyd_dup_to_ctx(src, 1, ctx);
            if (!node2) {
                lyd_free_withsiblings(node);
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    lyd_free_withsiblings(node);
                    goto error;
                }
            } else {
                node = node2;
            }

            if (options & LYD_OPT_NOSIBLINGS) {
                break;
            }
        }
    }

    if (src_merge_start) {
        /* insert data into the created parents */
        /* first, get the lowest created parent, we don't have to check the nodetype since we are
         * creating only a simple chain of containers */
        for (node2 = src_merge_start; node2->child; node2 = node2->child);
        node2->child = node;
        LY_TREE_FOR(node, node) {
            node->parent = node2;
        }
    } else {
        src_merge_start = node;
    }

    if (!first_iter) {
        /* !! src_merge start is a child(ren) of trg_merge_start */
        ret = lyd_merge_parent_children(trg_merge_start, src_merge_start, options);
    } else {
        /* !! src_merge start is a (top-level) sibling(s) of trg_merge_start */
        ret = lyd_merge_siblings(trg_merge_start, src_merge_start, options);
    }
    /* it was freed whatever the return value */
    src_merge_start = NULL;
    if (ret == 2) {
        /* clear remporary LYD_VAL_INUSE validation flags */
        LY_TREE_DFS_BEGIN(target, node2, node) {
            node->validity &= ~LYD_VAL_INUSE;
            LY_TREE_DFS_END(target, node2, node);
        }
        ret = 0;
    } else if (ret) {
        goto error;
    }

    if (target->schema->nodetype == LYS_RPC) {
        lyd_schema_sort(target, 1);
    }

    /* update the pointer to the target tree if needed */
    if (*trg != target) {
        lyd_free_withsiblings(*trg);
        (*trg) = target;
    }
    return ret;

error:
    if (*trg != target) {
        /* target is duplication of the original target in different context,
         * free it due to the error */
        lyd_free_withsiblings(target);
    }
    lyd_free_withsiblings(src_merge_start);
    return -1;
}